

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O3

Own<kj::_::ImmediatePromiseNode<void_*>_> __thiscall
kj::heap<kj::_::ImmediatePromiseNode<void*>,void*>(kj *this,void **params)

{
  ImmediatePromiseNode<void_*> *pIVar1;
  ImmediatePromiseNode<void_*> *extraout_RDX;
  ImmediatePromiseNode<void_*> *extraout_RDX_00;
  Own<kj::_::ImmediatePromiseNode<void_*>_> OVar2;
  ExceptionOr<void_*> local_188;
  
  pIVar1 = (ImmediatePromiseNode<void_*> *)operator_new(0x178);
  local_188.super_ExceptionOrValue.exception.ptr.isSet = false;
  local_188.value.ptr.isSet = true;
  local_188.value.ptr.field_1.value = *params;
  _::ImmediatePromiseNode<void_*>::ImmediatePromiseNode(pIVar1,&local_188);
  *(undefined8 **)this = &_::HeapDisposer<kj::_::ImmediatePromiseNode<void*>>::instance;
  *(ImmediatePromiseNode<void_*> **)(this + 8) = pIVar1;
  pIVar1 = extraout_RDX;
  if (local_188.super_ExceptionOrValue.exception.ptr.isSet == true) {
    Exception::~Exception(&local_188.super_ExceptionOrValue.exception.ptr.field_1.value);
    pIVar1 = extraout_RDX_00;
  }
  OVar2.ptr = pIVar1;
  OVar2.disposer = (Disposer *)this;
  return OVar2;
}

Assistant:

Own<T> heap(Params&&... params) {
  // heap<T>(...) allocates a T on the heap, forwarding the parameters to its constructor.  The
  // exact heap implementation is unspecified -- for now it is operator new, but you should not
  // assume this.  (Since we know the object size at delete time, we could actually implement an
  // allocator that is more efficient than operator new.)

  return Own<T>(new T(kj::fwd<Params>(params)...), _::HeapDisposer<T>::instance);
}